

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_wedge_utils_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::WedgeUtilsSSEOptTest_ExtremeValues_Test::
~WedgeUtilsSSEOptTest_ExtremeValues_Test(WedgeUtilsSSEOptTest_ExtremeValues_Test *this)

{
  WedgeUtilsSSEOptTest_ExtremeValues_Test *in_stack_00000010;
  
  anon_unknown.dwarf_f9fae3::WedgeUtilsSSEOptTest_ExtremeValues_Test::
  ~WedgeUtilsSSEOptTest_ExtremeValues_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(WedgeUtilsSSEOptTest, ExtremeValues) {
  DECLARE_ALIGNED(32, int16_t, r1[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int16_t, d[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, uint8_t, m[MAX_SB_SQUARE]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    if (rng_(2)) {
      for (int i = 0; i < MAX_SB_SQUARE; ++i) r1[i] = kInt13Max;
    } else {
      for (int i = 0; i < MAX_SB_SQUARE; ++i) r1[i] = -kInt13Max;
    }

    if (rng_(2)) {
      for (int i = 0; i < MAX_SB_SQUARE; ++i) d[i] = kInt13Max;
    } else {
      for (int i = 0; i < MAX_SB_SQUARE; ++i) d[i] = -kInt13Max;
    }

    for (int i = 0; i < MAX_SB_SQUARE; ++i) m[i] = MAX_MASK_VALUE;

    const int N = 64 * (rng_(MAX_SB_SQUARE / 64) + 1);

    const uint64_t ref_res = params_.ref_func(r1, d, m, N);
    uint64_t tst_res;
    API_REGISTER_STATE_CHECK(tst_res = params_.tst_func(r1, d, m, N));

    ASSERT_EQ(ref_res, tst_res);
  }
}